

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf_test.cc
# Opt level: O3

void __thiscall PBKDFTest_RFC6070Vectors_Test::TestBody(PBKDFTest_RFC6070Vectors_Test *this)

{
  int iVar1;
  EVP_MD *pEVar2;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar3;
  pointer message;
  pointer *__ptr;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  Bytes local_b0;
  AssertHelper local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  uint8_t kKey2 [20];
  uint8_t kKey1 [20];
  uint8_t kKey3 [16];
  uint8_t key [20];
  
  kKey1[0] = '\f';
  kKey1[1] = '`';
  kKey1[2] = 200;
  kKey1[3] = '\x0f';
  kKey1[4] = 0x96;
  kKey1[5] = '\x1f';
  kKey1[6] = '\x0e';
  kKey1[7] = 'q';
  kKey1[8] = 0xf3;
  kKey1[9] = 0xa9;
  kKey1[10] = 0xb5;
  kKey1[0xb] = '$';
  kKey1[0xc] = 0xaf;
  kKey1[0xd] = '`';
  kKey1[0xe] = '\x12';
  kKey1[0xf] = '\x06';
  kKey1[0x10] = '/';
  kKey1[0x11] = 0xe0;
  kKey1[0x12] = '7';
  kKey1[0x13] = 0xa6;
  kKey2[0] = 0xea;
  kKey2[1] = 'l';
  kKey2[2] = '\x01';
  kKey2[3] = 'M';
  kKey2[4] = 199;
  kKey2[5] = '-';
  kKey2[6] = 'o';
  kKey2[7] = 0x8c;
  kKey2[8] = 0xcd;
  kKey2[9] = '\x1e';
  kKey2[10] = 0xd9;
  kKey2[0xb] = '*';
  kKey2[0xc] = 0xce;
  kKey2[0xd] = '\x1d';
  kKey2[0xe] = 'A';
  kKey2[0xf] = 0xf0;
  kKey2[0x10] = 0xd8;
  kKey2[0x11] = 0xde;
  kKey2[0x12] = 0x89;
  kKey2[0x13] = 'W';
  kKey3[0] = 'V';
  kKey3[1] = 0xfa;
  kKey3[2] = 'j';
  kKey3[3] = 0xa7;
  kKey3[4] = 'U';
  kKey3[5] = 'H';
  kKey3[6] = '\t';
  kKey3[7] = 0x9d;
  kKey3[8] = 0xcc;
  kKey3[9] = '7';
  kKey3[10] = 0xd7;
  kKey3[0xb] = 0xf0;
  kKey3[0xc] = '4';
  kKey3[0xd] = '%';
  kKey3[0xe] = 0xe0;
  kKey3[0xf] = 0xc3;
  pEVar2 = EVP_sha1();
  iVar1 = PKCS5_PBKDF2_HMAC("password",8,"salt",4,1,pEVar2,0x14,key);
  local_c0[0] = iVar1 != 0;
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)local_c0,
               (AssertionResult *)
               "PKCS5_PBKDF2_HMAC(\"password\", 8, (const uint8_t *)\"salt\", 4, 1, EVP_sha1(), sizeof(kKey1), key)"
               ,"false","true",(char *)pEVar2);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/pbkdf_test.cc"
               ,0x4b,(char *)CONCAT71(local_98._1_7_,local_98[0]));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
    }
    local_90 = local_b8;
    if ((long *)local_b0.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_b0.span_.data_ + 8))();
      local_90 = local_b8;
    }
  }
  else {
    local_c0 = (undefined1  [8])kKey1;
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14;
    local_b0.span_.size_ = 0x14;
    local_b0.span_.data_ = key;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_98,"Bytes(kKey1)","Bytes(key, sizeof(kKey1))",(Bytes *)local_c0,
               &local_b0);
    if (local_98[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_c0);
      if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/pbkdf_test.cc"
                 ,0x4c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
      if (local_c0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c0 + 8))();
      }
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    pEVar2 = EVP_sha1();
    iVar1 = PKCS5_PBKDF2_HMAC("password",8,"salt",4,2,pEVar2,0x14,key);
    local_c0[0] = iVar1 != 0;
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_c0,
                 (AssertionResult *)
                 "PKCS5_PBKDF2_HMAC(\"password\", 8, (const uint8_t *)\"salt\", 4, 2, EVP_sha1(), sizeof(kKey2), key)"
                 ,"false","true",(char *)pEVar2);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/pbkdf_test.cc"
                 ,0x4f,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      local_90 = local_b8;
      if ((long *)local_b0.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_b0.span_.data_ + 8))();
        local_90 = local_b8;
      }
    }
    else {
      local_c0 = (undefined1  [8])kKey2;
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14;
      local_b0.span_.size_ = 0x14;
      local_b0.span_.data_ = key;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_98,"Bytes(kKey2)","Bytes(key, sizeof(kKey2))",(Bytes *)local_c0,
                 &local_b0);
      if (local_98[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_c0);
        if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = (local_90->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/pbkdf_test.cc"
                   ,0x50,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
        if (local_c0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_c0 + 8))();
        }
      }
      if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_90,local_90);
      }
      pEVar2 = EVP_sha1();
      iVar1 = PKCS5_PBKDF2_HMAC("pass",9,(uchar *)"sa",5,0x1000,pEVar2,0x10,key);
      local_c0[0] = iVar1 != 0;
      local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 != 0) {
        local_c0 = (undefined1  [8])kKey3;
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &DAT_00000010;
        local_b0.span_.size_ = 0x10;
        local_b0.span_.data_ = key;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)local_98,"Bytes(kKey3)","Bytes(key, sizeof(kKey3))",(Bytes *)local_c0
                   ,&local_b0);
        if (local_98[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_c0);
          if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            message = "";
          }
          else {
            message = (local_90->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/pbkdf_test.cc"
                     ,0x54,message);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_c0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
          if (local_c0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_c0 + 8))();
          }
        }
        if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          return;
        }
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90;
        goto LAB_0028d75a;
      }
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_c0,
                 (AssertionResult *)
                 "PKCS5_PBKDF2_HMAC(\"pass\\0word\", 9, (const uint8_t *)\"sa\\0lt\", 5, 4096, EVP_sha1(), sizeof(kKey3), key)"
                 ,"false","true",(char *)pEVar2);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/pbkdf_test.cc"
                 ,0x53,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      local_90 = local_b8;
      if ((long *)local_b0.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_b0.span_.data_ + 8))();
        local_90 = local_b8;
      }
    }
  }
  if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_b8;
  local_b8 = local_90;
LAB_0028d75a:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,local_90);
  return;
}

Assistant:

TEST(PBKDFTest, RFC6070Vectors) {
  const uint8_t kKey1[] = {0x0c, 0x60, 0xc8, 0x0f, 0x96, 0x1f, 0x0e,
                           0x71, 0xf3, 0xa9, 0xb5, 0x24, 0xaf, 0x60,
                           0x12, 0x06, 0x2f, 0xe0, 0x37, 0xa6};
  const uint8_t kKey2[] = {0xea, 0x6c, 0x01, 0x4d, 0xc7, 0x2d, 0x6f,
                           0x8c, 0xcd, 0x1e, 0xd9, 0x2a, 0xce, 0x1d,
                           0x41, 0xf0, 0xd8, 0xde, 0x89, 0x57};
  const uint8_t kKey3[] = {0x56, 0xfa, 0x6a, 0xa7, 0x55, 0x48, 0x09, 0x9d,
                           0xcc, 0x37, 0xd7, 0xf0, 0x34, 0x25, 0xe0, 0xc3};
  uint8_t key[sizeof(kKey1)];
  static_assert(sizeof(key) >= sizeof(kKey2), "output too small");
  static_assert(sizeof(key) >= sizeof(kKey3), "output too small");

  ASSERT_TRUE(PKCS5_PBKDF2_HMAC("password", 8, (const uint8_t *)"salt", 4, 1,
                                EVP_sha1(), sizeof(kKey1), key));
  EXPECT_EQ(Bytes(kKey1), Bytes(key, sizeof(kKey1)));

  ASSERT_TRUE(PKCS5_PBKDF2_HMAC("password", 8, (const uint8_t *)"salt", 4, 2,
                                EVP_sha1(), sizeof(kKey2), key));
  EXPECT_EQ(Bytes(kKey2), Bytes(key, sizeof(kKey2)));

  ASSERT_TRUE(PKCS5_PBKDF2_HMAC("pass\0word", 9, (const uint8_t *)"sa\0lt", 5,
                                4096, EVP_sha1(), sizeof(kKey3), key));
  EXPECT_EQ(Bytes(kKey3), Bytes(key, sizeof(kKey3)));
}